

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O0

int main(void)

{
  type pCVar1;
  ostream *poVar2;
  allocator<char> local_79;
  string local_78;
  unique_ptr<Contact,_std::default_delete<Contact>_> local_58;
  unique_ptr<Contact,_std::default_delete<Contact>_> jane;
  allocator<char> local_39;
  string local_38;
  unique_ptr<Contact,_std::default_delete<Contact>_> local_18;
  unique_ptr<Contact,_std::default_delete<Contact>_> john;
  
  john._M_t.super___uniq_ptr_impl<Contact,_std::default_delete<Contact>_>._M_t.
  super__Tuple_impl<0UL,_Contact_*,_std::default_delete<Contact>_>.
  super__Head_base<0UL,_Contact_*,_false>._M_head_impl._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"John Doe",&local_39);
  EmployeeFactory::make_main_office_employee((EmployeeFactory *)&local_18,&local_38,100);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pCVar1 = std::unique_ptr<Contact,_std::default_delete<Contact>_>::operator*(&local_18);
  poVar2 = operator<<((ostream *)&std::cout,pCVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Jane Doe",&local_79);
  EmployeeFactory::make_aux_office_employee((EmployeeFactory *)&local_58,&local_78,0x65);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pCVar1 = std::unique_ptr<Contact,_std::default_delete<Contact>_>::operator*(&local_58);
  poVar2 = operator<<((ostream *)&std::cout,pCVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  john._M_t.super___uniq_ptr_impl<Contact,_std::default_delete<Contact>_>._M_t.
  super__Tuple_impl<0UL,_Contact_*,_std::default_delete<Contact>_>.
  super__Head_base<0UL,_Contact_*,_false>._M_head_impl._4_4_ = 0;
  std::unique_ptr<Contact,_std::default_delete<Contact>_>::~unique_ptr(&local_58);
  std::unique_ptr<Contact,_std::default_delete<Contact>_>::~unique_ptr(&local_18);
  return john._M_t.super___uniq_ptr_impl<Contact,_std::default_delete<Contact>_>._M_t.
         super__Tuple_impl<0UL,_Contact_*,_std::default_delete<Contact>_>.
         super__Head_base<0UL,_Contact_*,_false>._M_head_impl._4_4_;
}

Assistant:

int main()
{
	// Customize John
	auto john{EmployeeFactory::make_main_office_employee("John Doe", 100)};
	std::cout << *john << std::endl;

	// Customize Jane
	auto jane{EmployeeFactory::make_aux_office_employee("Jane Doe", 101)};
	std::cout << *jane << std::endl;

	return 0;
}